

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O0

bool am_install_match_command(Am_Object *match_command,Am_Object *script_execute_command)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  ostream *poVar3;
  void *pvVar4;
  Am_Value *pAVar5;
  Am_Wrapper *pAVar6;
  Am_Method_Wrapper *pAVar7;
  Am_Method_Wrapper *pAVar8;
  undefined1 local_300 [8];
  Am_Object_Method do_method;
  Am_Object local_2e8;
  int local_2dc;
  undefined1 auStack_2d8 [4];
  int before_after;
  Am_Object_Method new_method;
  ostrstream local_2c0 [8];
  ostrstream oss;
  char local_158 [8];
  char line [250];
  Am_Object local_50;
  Am_Object widget;
  Am_Object installed_on_command;
  Am_Object local_30;
  Am_Object orig_command;
  Am_Object command;
  Am_Object *script_execute_command_local;
  Am_Object *match_command_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"\nInstalling match command ");
  poVar3 = operator<<(poVar3,match_command);
  poVar3 = std::operator<<(poVar3," for ");
  poVar3 = operator<<(poVar3,script_execute_command);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
  pAVar5 = Am_Object::Get(match_command,0xc5,0);
  Am_Object::Am_Object(&orig_command,pAVar5);
  Am_Object::Am_Object(&local_30);
  Am_Object::Am_Object(&widget);
  find_widget_for(&local_50,&orig_command);
  poVar3 = std::operator<<((ostream *)&std::cout,"Found widget ");
  poVar3 = operator<<(poVar3,&local_50);
  poVar3 = std::operator<<(poVar3," for ");
  poVar3 = operator<<(poVar3,&local_30);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
  pAVar5 = Am_Object::Peek(&orig_command,0x175,0);
  bVar2 = Am_Value::Valid(pAVar5);
  AVar1 = Am_WIDGET_FOR_COMMAND;
  if (bVar2) {
    std::ostrstream::ostrstream(local_2c0,local_158,0xfa,_S_out);
    poVar3 = std::operator<<((ostream *)local_2c0,"Sorry, invoking on ANY command not implemented");
    std::ostream::operator<<(poVar3,std::ends<char,std::char_traits<char>>);
    Am_Pop_Up_Error_Window(local_158);
    std::ostrstream::~ostrstream(local_2c0);
    match_command_local._7_1_ = false;
  }
  else {
    pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&local_50);
    Am_Object::Set(match_command,AVar1,pAVar6,0);
    AVar1 = Am_SCRIPT_EXECUTE_COMMAND;
    pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(script_execute_command);
    Am_Object::Set(match_command,AVar1,pAVar6,0);
    Am_Object_Method::Am_Object_Method((Am_Object_Method *)auStack_2d8);
    pAVar5 = Am_Object::Get(match_command,Am_BEFORE_OR_AFTER,0);
    local_2dc = Am_Value::operator_cast_to_int(pAVar5);
    if (local_2dc == 0x34) {
      _auStack_2d8 = am_after_match_do_method.from_wrapper;
      new_method.from_wrapper = (Am_Method_Wrapper *)am_after_match_do_method.Call;
      Am_Object::operator=(&widget,&local_30);
    }
    else {
      Am_Object::Am_Object(&local_2e8,&Am_Interactor);
      bVar2 = Am_Object::Is_Instance_Of(&local_50,&local_2e8);
      Am_Object::~Am_Object(&local_2e8);
      if (bVar2) {
        Am_Object::operator=(&widget,&local_50);
      }
      else {
        find_top_of_impl_chain((Am_Object *)&do_method.Call);
        Am_Object::operator=(&widget,(Am_Object *)&do_method.Call);
        Am_Object::~Am_Object((Am_Object *)&do_method.Call);
      }
      _auStack_2d8 = am_before_match_do_method.from_wrapper;
      new_method.from_wrapper = (Am_Method_Wrapper *)am_before_match_do_method.Call;
    }
    pAVar5 = Am_Object::Peek(&widget,Am_REAL_DO_METHOD,0);
    bVar2 = Am_Value::Valid(pAVar5);
    if (!bVar2) {
      pAVar5 = Am_Object::Get(&widget,0xca,0);
      Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_300,pAVar5);
      pAVar7 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_((Am_Object_Method *)local_300);
      pAVar8 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_after_match_do_method);
      if (pAVar7 != pAVar8) {
        pAVar7 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_
                           ((Am_Object_Method *)local_300);
        pAVar8 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_before_match_do_method);
        AVar1 = Am_REAL_DO_METHOD;
        if (pAVar7 != pAVar8) {
          pAVar7 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_
                             ((Am_Object_Method *)local_300);
          Am_Object::Set(&widget,AVar1,pAVar7,1);
        }
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"Setting DO_method of ");
    poVar3 = operator<<(poVar3,&local_30);
    poVar3 = std::operator<<(poVar3," to ");
    poVar3 = operator<<(poVar3,(Am_Object_Method *)auStack_2d8);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
    pAVar7 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_((Am_Object_Method *)auStack_2d8);
    Am_Object::Set(&widget,0xca,pAVar7,0);
    AVar1 = Am_INVOKE_MATCH_COMMAND;
    pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(match_command);
    Am_Object::Set(&widget,AVar1,pAVar6,1);
    AVar1 = Am_ORIG_COMMAND;
    pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&local_30);
    Am_Object::Set(match_command,AVar1,pAVar6,0);
    AVar1 = Am_INSTALLED_ON_COMMAND;
    pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&widget);
    Am_Object::Set(match_command,AVar1,pAVar6,0);
    match_command_local._7_1_ = true;
  }
  new_method.Call._4_4_ = 1;
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&widget);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&orig_command);
  return match_command_local._7_1_;
}

Assistant:

bool
am_install_match_command(Am_Object &match_command,
                         Am_Object &script_execute_command)
{
  std::cout << "\nInstalling match command " << match_command << " for "
            << script_execute_command << std::endl
            << std::flush;
  Am_Object command = match_command.Get(Am_COMMAND);
  Am_Object orig_command, installed_on_command;
  Am_Object widget = find_widget_for(command, orig_command);
  std::cout << "Found widget " << widget << " for " << orig_command << std::endl
            << std::flush;
  if (command.Peek(Am_REGISTER_COMMAND).Valid()) {
    AM_POP_UP_ERROR_WINDOW("Sorry, invoking on ANY command not implemented");
    return false;
  }
  match_command.Set(Am_WIDGET_FOR_COMMAND, widget);
  match_command.Set(Am_SCRIPT_EXECUTE_COMMAND, script_execute_command);
  Am_Object_Method new_method;
  int before_after = match_command.Get(Am_BEFORE_OR_AFTER);
  if (before_after == am_after_command) {
    new_method = am_after_match_do_method;
    installed_on_command = orig_command;
  } else {
    if (widget.Is_Instance_Of(Am_Interactor)) {
      //interactors do the work in the do method of the interactor,
      // instead of in the do method of the command object in the
      // interactor, so have to replace the do method of the interactor itself
      installed_on_command = widget;
    } else
      installed_on_command = find_top_of_impl_chain(orig_command);
    new_method = am_before_match_do_method;
  }
  if (!installed_on_command.Peek(Am_REAL_DO_METHOD).Valid()) {
    Am_Object_Method do_method = installed_on_command.Get(Am_DO_METHOD);
    if (do_method != am_after_match_do_method &&
        do_method != am_before_match_do_method)
      installed_on_command.Set(Am_REAL_DO_METHOD, do_method,
                               Am_OK_IF_NOT_THERE);
  }
  std::cout << "Setting DO_method of " << orig_command << " to " << new_method
            << std::endl
            << std::flush;
  installed_on_command.Set(Am_DO_METHOD, new_method);
  installed_on_command.Set(Am_INVOKE_MATCH_COMMAND, match_command,
                           Am_OK_IF_NOT_THERE);
  match_command.Set(Am_ORIG_COMMAND, orig_command);
  match_command.Set(Am_INSTALLED_ON_COMMAND, installed_on_command);
  return true;
}